

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writeSIT(TSMuxer *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  TSPacket *tsPacket;
  TSMuxer *this_local;
  
  if ((this->m_m2tsMode & 1U) != 0) {
    this->m_outBufLen = this->m_outBufLen + 4;
    this->m_processedBlockSize = this->m_processedBlockSize + 4;
    this->m_pcrBits = this->m_pcrBits + 0x20;
  }
  memcpy(this->m_outBuf + this->m_outBufLen,DefaultSitTableOne,0xbc);
  uVar1 = this->m_sitCnt;
  this->m_sitCnt = uVar1 + 1;
  *(uint *)(this->m_outBuf + this->m_outBufLen) =
       *(uint *)(this->m_outBuf + this->m_outBufLen) & 0xf0ffffff | (uVar1 & 0xf) << 0x18;
  this->m_outBufLen = this->m_outBufLen + 0xbc;
  this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
  this->m_pcrBits = this->m_pcrBits + 0x5e0;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_muxedPacketCnt);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_muxedPacketCnt,sVar2 - 1);
  *pvVar3 = *pvVar3 + 1;
  writeOutBuffer(this);
  return;
}

Assistant:

void TSMuxer::writeSIT()
{
    if (m_m2tsMode)
    {
        m_outBufLen += 4;
        m_processedBlockSize += 4;
        m_pcrBits += 4 * 8;
    }
    memcpy(m_outBuf + m_outBufLen, DefaultSitTableOne, TS_FRAME_SIZE);
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
    tsPacket->counter = m_sitCnt++;
    m_outBufLen += TS_FRAME_SIZE;
    m_processedBlockSize += TS_FRAME_SIZE;
    m_pcrBits += TS_FRAME_SIZE * 8;
    m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
    writeOutBuffer();
}